

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

duckdb_error_type duckdb_result_error_type(duckdb_result *result)

{
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *this;
  bool bVar1;
  duckdb_error_type dVar2;
  pointer pQVar3;
  ExceptionType *pEVar4;
  
  if ((result != (duckdb_result *)0x0) &&
     (this = (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             result->internal_data,
     this != (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)0x0)
     ) {
    pQVar3 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->(this);
    bVar1 = duckdb::BaseQueryResult::HasError(&pQVar3->super_BaseQueryResult);
    if (bVar1) {
      pQVar3 = duckdb::
               unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
               operator->(this);
      pEVar4 = duckdb::BaseQueryResult::GetErrorType(&pQVar3->super_BaseQueryResult);
      dVar2 = duckdb::CAPIErrorType(*pEVar4);
      return dVar2;
    }
  }
  return DUCKDB_ERROR_INVALID;
}

Assistant:

duckdb_error_type duckdb_result_error_type(duckdb_result *result) {
	if (!result || !result->internal_data) {
		return DUCKDB_ERROR_INVALID;
	}
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result->internal_data));
	if (!result_data.result->HasError()) {
		return DUCKDB_ERROR_INVALID;
	}
	return duckdb::CAPIErrorType(result_data.result->GetErrorType());
}